

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O2

void ngx_rbtree_left_rotate
               (ngx_rbtree_node_t **root,ngx_rbtree_node_t *sentinel,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *pnVar1;
  ngx_rbtree_node_t *pnVar2;
  
  pnVar1 = node->right;
  pnVar2 = pnVar1->left;
  node->right = pnVar2;
  if (pnVar2 != sentinel) {
    pnVar2->parent = node;
  }
  pnVar2 = node->parent;
  pnVar1->parent = pnVar2;
  if (*root != node) {
    root = &pnVar2->right;
    if (pnVar2->left == node) {
      root = &pnVar2->left;
    }
  }
  *root = pnVar1;
  pnVar1->left = node;
  node->parent = pnVar1;
  return;
}

Assistant:

static ngx_inline void
ngx_rbtree_left_rotate(ngx_rbtree_node_t **root, ngx_rbtree_node_t *sentinel,
    ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  *temp;

    temp = node->right;
    node->right = temp->left;

    if (temp->left != sentinel) {
        temp->left->parent = node;
    }

    temp->parent = node->parent;

    if (node == *root) {
        *root = temp;

    } else if (node == node->parent->left) {
        node->parent->left = temp;

    } else {
        node->parent->right = temp;
    }

    temp->left = node;
    node->parent = temp;
}